

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::~QAbstractItemView(QAbstractItemView *this)

{
  QAbstractItemViewPrivate *this_00;
  undefined8 *in_RDI;
  QAbstractItemViewPrivate *d;
  QAbstractItemViewPrivate *in_stack_000000f8;
  
  *in_RDI = &PTR_metaObject_00d2bfe8;
  in_RDI[2] = &PTR__QAbstractItemView_00d2c2f8;
  this_00 = d_func((QAbstractItemView *)0x80061a);
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QBasicTimer::stop();
  QAbstractItemViewPrivate::disconnectAll(in_stack_000000f8);
  QAbstractScrollArea::~QAbstractScrollArea((QAbstractScrollArea *)this_00);
  return;
}

Assistant:

QAbstractItemView::~QAbstractItemView()
{
    Q_D(QAbstractItemView);
    // stop these timers here before ~QObject
    d->delayedReset.stop();
    d->updateTimer.stop();
    d->delayedEditing.stop();
    d->delayedAutoScroll.stop();
    d->autoScrollTimer.stop();
    d->delayedLayout.stop();
    d->fetchMoreTimer.stop();
    d->disconnectAll();
}